

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointOnCurveProjection.h
# Opt level: O1

void __thiscall
anurbs::PointOnCurveProjection<3L>::PointOnCurveProjection
          (PointOnCurveProjection<3L> *this,Pointer<CurveBaseD>_conflict *curve,double tolerance,
          double tessellation_tolerance)

{
  Unique<PolylineMapper<3L>_> *this_00;
  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  *args;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  CurveTessellation<3L> *this_01;
  _Head_base<0UL,_anurbs::PolylineMapper<3L>_*,_false> __ptr_00;
  pointer pdVar2;
  CurveBaseD *in_RDX;
  pointer *__ptr;
  pointer *__ptr_1;
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  local_58;
  
  (this->m_tessellation).second.
  super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_tessellation).second.
  super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_tessellation).first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_tessellation).second.
  super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_tessellation).first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_tessellation).first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_curve).super___shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (curve->super___shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (curve->super___shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->m_curve).super___shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->m_tessellation_tolerance = tessellation_tolerance;
  this->m_tolerance = tolerance;
  (this->mapper)._M_t.
  super___uniq_ptr_impl<anurbs::PolylineMapper<3L>,_std::default_delete<anurbs::PolylineMapper<3L>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_anurbs::PolylineMapper<3L>_*,_std::default_delete<anurbs::PolylineMapper<3L>_>_>
  .super__Head_base<0UL,_anurbs::PolylineMapper<3L>_*,_false>._M_head_impl =
       (PolylineMapper<3L> *)0x0;
  this_01 = (CurveTessellation<3L> *)
            (this->m_curve).super___shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  p_Var1 = (this->m_curve).super___shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this_00 = &this->mapper;
  CurveTessellation<3L>::compute(&local_58,this_01,in_RDX,this->m_tessellation_tolerance);
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            ((vector<double,_std::allocator<double>_> *)this,&local_58);
  args = &(this->m_tessellation).second;
  std::
  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ::_M_move_assign(args,&local_58.second);
  if (local_58.second.
      super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.second.
                    super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.second.
                          super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.second.
                          super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((PolylineMapper<3L> *)
      local_58.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (PolylineMapper<3L> *)0x0) {
    operator_delete(local_58.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.first.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.first.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  new_<anurbs::PolylineMapper<3l>,std::vector<Eigen::Matrix<double,1,3,1,1,3>,std::allocator<Eigen::Matrix<double,1,3,1,1,3>>>&>
            ((anurbs *)&local_58,args);
  pdVar2 = local_58.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_58.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  __ptr_00._M_head_impl =
       (this_00->_M_t).
       super___uniq_ptr_impl<anurbs::PolylineMapper<3L>,_std::default_delete<anurbs::PolylineMapper<3L>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_anurbs::PolylineMapper<3L>_*,_std::default_delete<anurbs::PolylineMapper<3L>_>_>
       .super__Head_base<0UL,_anurbs::PolylineMapper<3L>_*,_false>._M_head_impl;
  (this_00->_M_t).
  super___uniq_ptr_impl<anurbs::PolylineMapper<3L>,_std::default_delete<anurbs::PolylineMapper<3L>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_anurbs::PolylineMapper<3L>_*,_std::default_delete<anurbs::PolylineMapper<3L>_>_>
  .super__Head_base<0UL,_anurbs::PolylineMapper<3L>_*,_false>._M_head_impl =
       (PolylineMapper<3L> *)pdVar2;
  if (__ptr_00._M_head_impl != (PolylineMapper<3L> *)0x0) {
    std::default_delete<anurbs::PolylineMapper<3L>_>::operator()
              ((default_delete<anurbs::PolylineMapper<3L>_> *)this_00,__ptr_00._M_head_impl);
  }
  if ((PolylineMapper<3L> *)
      local_58.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (PolylineMapper<3L> *)0x0) {
    std::default_delete<anurbs::PolylineMapper<3L>_>::operator()
              ((default_delete<anurbs::PolylineMapper<3L>_> *)&local_58,
               (PolylineMapper<3L> *)
               local_58.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

PointOnCurveProjection(Pointer<CurveBaseD> curve, const double tolerance, const double tessellation_tolerance)
        : m_tessellation()
        , m_curve(curve)
        , m_tessellation_tolerance(tessellation_tolerance)
        , m_tolerance(tolerance)
    {
        // new_ polyline
        m_tessellation = CurveTessellation<TDimension>::compute(*Curve(), m_tessellation_tolerance);
        mapper = new_<PolylineMapper<TDimension>>(m_tessellation.second);
    }